

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRegistry::TestRegistry(TestRegistry *this)

{
  TestRegistry *this_local;
  
  ITestCaseRegistry::ITestCaseRegistry(&this->super_ITestCaseRegistry);
  (this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry =
       (_func_int **)&PTR__TestRegistry_002f8b60;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector(&this->m_functions);
  this->m_currentSortOrder = InDeclarationOrder;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector(&this->m_sortedFunctions);
  this->m_unnamedCount = 0;
  std::ios_base::Init::Init(&this->m_ostreamInit);
  return;
}

Assistant:

TestRegistry()
        :   m_currentSortOrder( RunTests::InDeclarationOrder ),
            m_unnamedCount( 0 )
        {}